

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS_linux_common.cpp
# Opt level: O0

bool __thiscall
OS::Services_Common::GetControl(Services_Common *this,string *name,void *pValue,size_t size)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ulong in_RCX;
  int *in_RDX;
  string *in_RSI;
  char *envVal;
  string fileName;
  bool found;
  char *pStr;
  uint *puVal;
  char *envVal_1;
  string envName;
  size_t in_stack_000003c8;
  void *in_stack_000003d0;
  string *in_stack_000003d8;
  string *in_stack_000003e0;
  Services_Common *in_stack_000003e8;
  string local_a8 [39];
  byte local_81;
  int *local_80;
  int local_74;
  int *local_70;
  char *local_68;
  allocator local_49;
  string local_48 [32];
  ulong local_28;
  int *local_20;
  string *local_18;
  byte local_1;
  
  pcVar2 = ENV_PREFIX;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar2,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::__cxx11::string::operator+=(local_48,local_18);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_68 = getenv(pcVar2);
  if ((local_68 == (char *)0x0) || (local_28 != 4)) {
    if ((local_68 == (char *)0x0) || (sVar3 = strlen(local_68), local_28 <= sVar3)) {
      local_74 = 0;
    }
    else {
      local_80 = local_20;
      strcpy((char *)local_20,local_68);
      local_1 = 1;
      local_74 = 1;
    }
  }
  else {
    local_70 = local_20;
    iVar1 = atoi(local_68);
    *local_70 = iVar1;
    local_1 = 1;
    local_74 = 1;
  }
  std::__cxx11::string::~string(local_48);
  if (local_74 == 0) {
    local_81 = 0;
    std::__cxx11::string::string(local_a8);
    pcVar2 = getenv("HOME");
    if (((local_81 & 1) == 0) && (pcVar2 != (char *)0x0)) {
      std::__cxx11::string::operator=(local_a8,pcVar2);
      std::__cxx11::string::operator+=(local_a8,"/");
      std::__cxx11::string::operator+=(local_a8,CONFIG_FILE);
      local_81 = GetControlFromFile(in_stack_000003e8,in_stack_000003e0,in_stack_000003d8,
                                    in_stack_000003d0,in_stack_000003c8);
    }
    if ((local_81 & 1) == 0) {
      std::__cxx11::string::operator=(local_a8,SYSTEM_DIR);
      std::__cxx11::string::operator+=(local_a8,"/");
      std::__cxx11::string::operator+=(local_a8,CONFIG_FILE);
      local_81 = GetControlFromFile(in_stack_000003e8,in_stack_000003e0,in_stack_000003d8,
                                    in_stack_000003d0,in_stack_000003c8);
    }
    local_1 = local_81 & 1;
    local_74 = 1;
    std::__cxx11::string::~string(local_a8);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Services_Common::GetControl(
    const std::string& name,
    void* pValue,
    size_t size ) const
{
    // Look at environment variables first:
    {
        std::string envName(ENV_PREFIX);
        envName += name;
        const char *envVal = getenv(envName.c_str());
        if( ( envVal != NULL ) && ( size == sizeof(unsigned int) ) )
        {
            unsigned int *puVal = (unsigned int *)pValue;
            *puVal = atoi(envVal);
            return true;
        }
        else if( ( envVal != NULL ) && ( strlen(envVal) < size ) )
        {
            char* pStr = (char*)pValue;
            strcpy( pStr, envVal );
            return true;
        }
    }

    // Look at config files second:
    bool    found = false;
    std::string fileName;

    // First, check for a config file in the HOME directory.
    const char *envVal = getenv("HOME");
    if( !found && envVal != NULL )
    {
        fileName = envVal;
        fileName += "/";
        fileName += CONFIG_FILE;
        found = GetControlFromFile(
            fileName,
            name,
            pValue,
            size );
    }

#ifdef __ANDROID__
    // On Android, check the sdcard directory next.
    if( !found )
    {
        fileName = "/sdcard/";
        fileName += CONFIG_FILE;
        found = GetControlFromFile(
            fileName,
            name,
            pValue,
            size );
    }
#endif

    // Finally, check the "system" directory.
    if( !found )
    {
        fileName = SYSTEM_DIR;
        fileName += "/";
        fileName += CONFIG_FILE;
        found = GetControlFromFile(
            fileName,
            name,
            pValue,
            size );
    }

    return found;
}